

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

TestFactoryBase * __thiscall
testing::internal::
TestMetaFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchMessageType_Test>
::CreateTestFactory(TestMetaFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchMessageType_Test>
                    *this,ParamType *parameter)

{
  ParameterizedTestFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchMessageType_Test>
  *this_00;
  ParamType local_30;
  
  this_00 = (ParameterizedTestFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchMessageType_Test>
             *)operator_new(0x28);
  std::__cxx11::string::string((string *)&local_30,(string *)parameter);
  ParameterizedTestFactory<google::protobuf::descriptor_unittest::ExtensionDeclarationsTest_MismatchMessageType_Test>
  ::ParameterizedTestFactory(this_00,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return &this_00->super_TestFactoryBase;
}

Assistant:

TestFactoryBase* CreateTestFactory(ParamType parameter) override {
    return new ParameterizedTestFactory<TestSuite>(parameter);
  }